

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O1

wchar_t lzx_br_fillup(lzx_stream *strm,lzx_br *br)

{
  long lVar1;
  byte *pbVar2;
  uchar *puVar3;
  int iVar4;
  int iVar5;
  uchar *p;
  
  iVar4 = 0x40 - br->cache_avail;
  while( true ) {
    iVar5 = iVar4 >> 4;
    if (iVar5 == 3) {
      lVar1 = strm->avail_in;
      if (5 < lVar1) {
        pbVar2 = strm->next_in;
        br->cache_buffer =
             (ulong)pbVar2[4] |
             (ulong)pbVar2[5] << 8 |
             (ulong)pbVar2[2] << 0x10 |
             (ulong)pbVar2[3] << 0x18 |
             (ulong)*pbVar2 << 0x20 | (ulong)pbVar2[1] << 0x28 | br->cache_buffer << 0x30;
        strm->next_in = pbVar2 + 6;
        strm->avail_in = lVar1 + -6;
        br->cache_avail = br->cache_avail + L'0';
        return L'\x01';
      }
    }
    else if (iVar5 == 4) {
      lVar1 = strm->avail_in;
      if (7 < lVar1) {
        pbVar2 = strm->next_in;
        br->cache_buffer =
             (ulong)pbVar2[6] |
             (ulong)pbVar2[7] << 8 |
             (ulong)pbVar2[4] << 0x10 |
             (ulong)pbVar2[5] << 0x18 |
             (ulong)pbVar2[2] << 0x20 |
             (ulong)pbVar2[3] << 0x28 | (ulong)*pbVar2 << 0x30 | (ulong)pbVar2[1] << 0x38;
        strm->next_in = pbVar2 + 8;
        strm->avail_in = lVar1 + -8;
        br->cache_avail = br->cache_avail + L'@';
        return L'\x01';
      }
    }
    else if (iVar5 == 0) {
      return L'\x01';
    }
    lVar1 = strm->avail_in;
    if (lVar1 < 2) break;
    pbVar2 = strm->next_in;
    br->cache_buffer = (ulong)pbVar2[1] << 8 | (ulong)*pbVar2 | br->cache_buffer << 0x10;
    strm->next_in = pbVar2 + 2;
    strm->avail_in = lVar1 + -2;
    br->cache_avail = br->cache_avail + L'\x10';
    iVar4 = iVar4 + -0x10;
  }
  if (lVar1 == 1) {
    puVar3 = strm->next_in;
    strm->next_in = puVar3 + 1;
    br->odd = *puVar3;
    strm->avail_in = 0;
    br->have_odd = '\x01';
    return L'\0';
  }
  return L'\0';
}

Assistant:

static int
lzx_br_fillup(struct lzx_stream *strm, struct lzx_br *br)
{
/*
 * x86 processor family can read misaligned data without an access error.
 */
	int n = CACHE_BITS - br->cache_avail;

	for (;;) {
		switch (n >> 4) {
		case 4:
			if (strm->avail_in >= 8) {
				br->cache_buffer =
				    ((uint64_t)strm->next_in[1]) << 56 |
				    ((uint64_t)strm->next_in[0]) << 48 |
				    ((uint64_t)strm->next_in[3]) << 40 |
				    ((uint64_t)strm->next_in[2]) << 32 |
				    ((uint32_t)strm->next_in[5]) << 24 |
				    ((uint32_t)strm->next_in[4]) << 16 |
				    ((uint32_t)strm->next_in[7]) << 8 |
				     (uint32_t)strm->next_in[6];
				strm->next_in += 8;
				strm->avail_in -= 8;
				br->cache_avail += 8 * 8;
				return (1);
			}
			break;
		case 3:
			if (strm->avail_in >= 6) {
				br->cache_buffer =
		 		   (br->cache_buffer << 48) |
				    ((uint64_t)strm->next_in[1]) << 40 |
				    ((uint64_t)strm->next_in[0]) << 32 |
				    ((uint32_t)strm->next_in[3]) << 24 |
				    ((uint32_t)strm->next_in[2]) << 16 |
				    ((uint32_t)strm->next_in[5]) << 8 |
				     (uint32_t)strm->next_in[4];
				strm->next_in += 6;
				strm->avail_in -= 6;
				br->cache_avail += 6 * 8;
				return (1);
			}
			break;
		case 0:
			/* We have enough compressed data in
			 * the cache buffer.*/
			return (1);
		default:
			break;
		}
		if (strm->avail_in < 2) {
			/* There is not enough compressed data to
			 * fill up the cache buffer. */
			if (strm->avail_in == 1) {
				br->odd = *strm->next_in++;
				strm->avail_in--;
				br->have_odd = 1;
			}
			return (0);
		}
		br->cache_buffer =
		   (br->cache_buffer << 16) |
		    archive_le16dec(strm->next_in);
		strm->next_in += 2;
		strm->avail_in -= 2;
		br->cache_avail += 16;
		n -= 16;
	}
}